

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

bool __thiscall TSMuxer::muxPacket(TSMuxer *this,AVPacket *avPacket)

{
  map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
  *this_00;
  uint uVar1;
  pointer plVar2;
  TSMuxer *pTVar3;
  bool bVar4;
  long lVar5;
  mapped_type_conflict2 *pmVar6;
  mapped_type *pmVar7;
  longlong lVar8;
  byte *pbVar9;
  undefined4 *puVar10;
  bool bVar11;
  byte pesStreamID;
  int iVar12;
  long lVar13;
  int64_t iVar14;
  int tsIndex;
  ostringstream ss;
  int local_1d4;
  int *local_1d0;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  if (avPacket->data == (uint8_t *)0x0) {
    return true;
  }
  if (avPacket->size == 0) {
    return true;
  }
  if (avPacket->stream_index == this->m_mainStreamIndex) {
    if (avPacket->codec == (BaseAbstractStreamReader *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                             &MPEGStreamReader::typeinfo,0);
    }
    if (lVar5 != 0) {
      this->m_additionCLPISize = (long)(5292000000.0 / *(double *)(lVar5 + 0x88));
    }
    plVar2 = (this->m_lastPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar5 = plVar2[-1];
    lVar13 = 0;
    if (0 < avPacket->duration) {
      lVar13 = avPacket->duration;
    }
    lVar13 = lVar13 + avPacket->pts;
    if (lVar13 < lVar5) {
      lVar13 = lVar5;
    }
    plVar2[-1] = lVar13;
  }
  plVar2 = (this->m_firstPts).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar2[-1] == -1) {
    lVar5 = avPacket->pts;
    this->m_curFileStartPts = lVar5;
    lVar13 = (lVar5 / 0xe5b0 + this->m_timeOffset) - this->m_vbvLen;
    lVar5 = 0;
    if (0 < lVar13) {
      lVar5 = lVar13;
    }
    this->m_fixed_pcr_offset = lVar5;
    this->m_prevM2TSPCR = lVar5 * 300 + -30000;
    plVar2[-1] = avPacket->pts;
  }
  if (this->m_pcr_delta == -1) {
    this->m_pcr_delta = 7000;
    iVar12 = 0x57e4;
    if (this->m_m2tsMode != false) {
      iVar12 = 7000;
    }
    this->m_patPmtDelta = iVar12;
  }
  local_1d0 = &avPacket->stream_index;
  if (this->m_minDts == -1) {
    this->m_minDts = avPacket->dts;
  }
  pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_extIndexToTSIndex,local_1d0);
  local_1d4 = *pmVar6;
  if (local_1d4 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unknown track number ",0x15);
    std::ostream::operator<<((ostream *)local_1a8,*local_1d0);
    puVar10 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar10 = 200;
    *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
    if (local_1c8 == &local_1b8) {
      puVar10[6] = local_1b8;
      puVar10[7] = uStack_1b4;
      puVar10[8] = uStack_1b0;
      puVar10[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar10 + 2) = local_1c8;
      *(ulong *)(puVar10 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar10 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar10,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  lVar5 = (avPacket->dts - this->m_minDts) / 0xe5b0 + this->m_fixed_pcr_offset;
  if (this->m_lastPCR == -1) {
    writePATPMT(this,lVar5,true);
    writePCR(this,lVar5);
  }
  lVar13 = avPacket->dts;
  this_00 = &this->m_streamInfo;
  pmVar7 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&local_1d4);
  if ((((lVar13 != pmVar7->m_dts) ||
       (lVar13 = avPacket->pts,
       pmVar7 = std::
                map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
                ::operator[](this_00,&local_1d4), lVar13 != pmVar7->m_pts)) ||
      (local_1d4 != this->m_lastTSIndex)) || (bVar11 = true, (avPacket->flags & 4) != 0)) {
    writePESPacket(this);
    bVar11 = false;
  }
  this->m_lastTSIndex = local_1d4;
  if (((this->m_cbrBitrate != -1) && (this->m_lastPCR != -1)) &&
     (lVar8 = llround(((double)(this->m_lastPCR + (long)this->m_pcrBits) * 90000.0) /
                      (double)this->m_cbrBitrate), lVar5 <= lVar8)) {
    lVar5 = lVar8;
  }
  if (bVar11) {
LAB_001dcf8d:
    if (((long)this->m_pcr_delta <= lVar5 - this->m_lastPCR) &&
       (((this->super_AbstractMuxer).m_interliaveBlockSize == 0 ||
        (*local_1d0 == this->m_mainStreamIndex)))) {
      writePATPMT(this,lVar5,false);
      writePCR(this,lVar5);
    }
  }
  else {
    bVar11 = this->m_canSwithBlock;
    if ((bVar11 == true) && (bVar4 = isSplitPoint(this,avPacket), bVar4)) {
      iVar14 = avPacket->pts;
      bVar11 = true;
    }
    else {
      uVar1 = (this->super_AbstractMuxer).m_interliaveBlockSize;
      if ((bVar11 != true || (int)uVar1 < 1) ||
         ((this->m_processedBlockSize < (long)(ulong)uVar1 &&
          ((pTVar3 = this->m_sublingMuxer, pTVar3 == (TSMuxer *)0x0 ||
           (pTVar3->m_processedBlockSize < (long)(pTVar3->super_AbstractMuxer).m_interliaveBlockSize
           )))))) goto LAB_001dcf8d;
      iVar14 = avPacket->pts;
      bVar11 = false;
    }
    finishFileBlock(this,iVar14,lVar5,bVar11,true);
  }
  iVar14 = avPacket->pts;
  pmVar7 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&local_1d4);
  pmVar7->m_pts = iVar14;
  iVar14 = avPacket->dts;
  pmVar7 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](this_00,&local_1d4);
  pmVar7->m_dts = iVar14;
  pbVar9 = std::
           map<int,_unsigned_char,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_char>_>_>
           ::operator[](&this->m_pesType,&local_1d4);
  pesStreamID = this->m_useNewStyleAudioPES << 6 | 0xbd;
  if (0xb9 < *pbVar9) {
    pesStreamID = *pbVar9;
  }
  addData(this,pesStreamID,local_1d4,avPacket);
  if (avPacket->codec == (BaseAbstractStreamReader *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(avPacket->codec,&BaseAbstractStreamReader::typeinfo,
                           &MPEGStreamReader::typeinfo,0);
  }
  if (avPacket->duration < 1) {
    lVar13 = avPacket->dts;
    if (lVar5 != 0) {
      lVar13 = lVar13 + (long)(5292000000.0 / *(double *)(lVar5 + 0x88));
    }
  }
  else {
    lVar13 = avPacket->duration + avPacket->dts;
  }
  this->m_endStreamDTS = lVar13;
  return true;
}

Assistant:

bool TSMuxer::muxPacket(AVPacket& avPacket)
{
    if (avPacket.data == nullptr || avPacket.size == 0)
    {
        return true;
    }

#ifdef _DEBUG
    // assert (avPacket.dts >= m_lastProcessedDts);
    m_lastProcessedDts = avPacket.dts;
    m_lastStreamIndex = avPacket.stream_index;
#endif

    if (avPacket.stream_index == m_mainStreamIndex)
    {
        const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
        if (mpegReader)
            m_additionCLPISize = static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());

        if (avPacket.duration > 0)
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts + avPacket.duration);
        else
            *m_lastPts.rbegin() = FFMAX(*m_lastPts.rbegin(), avPacket.pts);
    }
    if (m_firstPts[m_firstPts.size() - 1] == -1 /*|| avPacket.pts < m_firstPts[m_firstPts.size()-1]*/)
    {
        if (m_firstPts[m_firstPts.size() - 1] == -1)
        {
            m_curFileStartPts = avPacket.pts;
            const int64_t firstPtsShift = internalClockToPts(avPacket.pts);
            m_fixed_pcr_offset = m_timeOffset - m_vbvLen + firstPtsShift;
            if (m_fixed_pcr_offset < 0)
                m_fixed_pcr_offset = 0;
            m_prevM2TSPCR = (m_fixed_pcr_offset - 100) *
                            300;  // add a little extra delta (100) to prevent 0 bitrate for first several packets
        }
        m_firstPts[m_firstPts.size() - 1] = avPacket.pts;
    }

    if (m_pcr_delta == -1)
    {
        if (m_cbrBitrate != -1)
            m_pcr_delta = M_CBR_PCR_DELTA;
        else
            m_pcr_delta = M_PCR_DELTA;
        m_patPmtDelta = m_m2tsMode ? M_PCR_DELTA : PCR_FREQUENCY / 4;
    }

    if (m_minDts == -1)
        m_minDts = avPacket.dts;

    const int tsIndex = m_extIndexToTSIndex[avPacket.stream_index];
    if (tsIndex == 0)
        THROW(ERR_TS_COMMON, "Unknown track number " << avPacket.stream_index)

    auto newPCR = (avPacket.dts - m_minDts) / INT_FREQ_TO_TS_FREQ + m_fixed_pcr_offset;
    if (m_lastPCR == -1)
    {
        writePATPMT(newPCR, true);
        writePCR(newPCR);
    }

    bool newPES = false;
    if (avPacket.dts != m_streamInfo[tsIndex].m_dts || avPacket.pts != m_streamInfo[tsIndex].m_pts ||
        tsIndex != m_lastTSIndex || avPacket.flags & AVPacket::FORCE_NEW_FRAME)
    {
        writePESPacket();
        newPES = true;
    }

    m_lastTSIndex = tsIndex;

    if (m_cbrBitrate != -1 && m_lastPCR != -1)
    {
        const auto cbrPCR = llround(static_cast<double>(m_lastPCR + m_pcrBits) * 90000.0 / m_cbrBitrate);
        newPCR = FFMAX(newPCR, cbrPCR);
    }

    if (newPES && m_canSwithBlock && isSplitPoint(avPacket))
    {
        finishFileBlock(avPacket.pts, newPCR, true);  // goto next file
    }
    else if (newPES && m_interliaveBlockSize > 0 && m_canSwithBlock &&
             (blockFull() || (m_sublingMuxer && m_sublingMuxer->blockFull())))
    {
        finishFileBlock(avPacket.pts, newPCR, false);  // interleave SSIF here
    }
    else if (newPCR - m_lastPCR >= m_pcr_delta)
    {
        if (m_interliaveBlockSize == 0 || avPacket.stream_index == m_mainStreamIndex)
        {
            writePATPMT(newPCR);
            writePCR(newPCR);
        }
    }

    m_streamInfo[tsIndex].m_pts = avPacket.pts;
    m_streamInfo[tsIndex].m_dts = avPacket.dts;
    uint8_t pesStreamID = m_pesType[tsIndex];
    if (pesStreamID <= SYSTEM_START_CODE)
    {
        if (m_useNewStyleAudioPES)
            pesStreamID = PES_VC1_ID;
        else
            pesStreamID = PES_PRIVATE_DATA1;
    }

    addData(pesStreamID, tsIndex, avPacket);

    const auto mpegReader = dynamic_cast<MPEGStreamReader*>(avPacket.codec);
    if (avPacket.duration > 0)
        m_endStreamDTS = avPacket.dts + avPacket.duration;
    else if (mpegReader)
        m_endStreamDTS = avPacket.dts + static_cast<int64_t>(INTERNAL_PTS_FREQ / mpegReader->getFPS());
    else
        m_endStreamDTS = avPacket.dts;

    return true;
}